

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::tighten(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  type_conflict5 tVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  ulong uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  double local_e0;
  undefined1 local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  uint local_c8 [11];
  undefined3 uStack_9b;
  undefined5 uStack_98;
  undefined8 local_90;
  cpp_dec_float<100U,_int,_void> local_80;
  
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_d8 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_80,
             (double)(~uVar4 & (ulong)(*(Real *)((long)local_d8 + 0x40) * 1e-05) |
                     uVar4 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  pnVar3 = &this->fastDelta;
  local_90._0_4_ = cpp_dec_float_finite;
  local_90._4_4_ = 0x10;
  local_d8 = (undefined1  [8])0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  stack0xffffffffffffff60 = 0;
  uStack_9b = 0;
  uStack_98._0_4_ = 0;
  uStack_98._4_1_ = false;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((cpp_dec_float<100U,_int,_void> *)local_d8,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta.m_backend,&local_80);
  tVar2 = boost::multiprecision::operator>=
                    (pnVar3,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_d8);
  if (tVar2) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&pnVar3->m_backend,&local_80);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    uVar4 = -(ulong)(*(Real *)((long)local_d8 + 0x40) == 1.0);
    local_e0 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_d8 + 0x40) * 0.0001) |
                       uVar4 & 0x3f1a36e2eb1c432d);
    tVar2 = boost::multiprecision::operator>(pnVar3,&local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
    if (tVar2) {
      local_90._0_4_ = cpp_dec_float_finite;
      local_90._4_4_ = 0x10;
      local_d8 = (undefined1  [8])0x0;
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8[8] = 0;
      local_c8[9] = 0;
      stack0xffffffffffffff60 = 0;
      uStack_9b = 0;
      uStack_98._0_4_ = 0;
      uStack_98._4_1_ = false;
      local_c8[0] = 0;
      local_c8[1] = 0;
      local_c8[2] = 0;
      local_c8[3] = 0;
      local_c8[4] = 0;
      local_c8[5] = 0;
      local_c8[6] = 0;
      local_c8[7] = 0;
      local_e0 = 9.88131291682493e-324;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_80,(longlong *)&local_e0);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&pnVar3->m_backend,(cpp_dec_float<100U,_int,_void> *)local_d8);
    }
  }
  pnVar3 = &this->minStab;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_d8 + 0x40) == 1.0);
  local_e0 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_d8 + 0x40) * 1e-05) |
                     uVar4 & 0x3ee4f8b588e368f1);
  tVar2 = boost::multiprecision::operator<(pnVar3,&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  if (tVar2) {
    local_d8 = (undefined1  [8])0x3feccccccccccccd;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              (&pnVar3->m_backend,(double *)local_d8);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_e0 = Tolerances::floatingPointFeastol((Tolerances *)local_d8);
    tVar2 = boost::multiprecision::operator<(pnVar3,&local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
    if (tVar2) {
      local_d8 = (undefined1  [8])0x3feccccccccccccd;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&pnVar3->m_backend,(double *)local_d8);
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}